

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool MeCab::FeatureIndex::compile(Param *param,char *txtfile,char *binfile)

{
  ostream *poVar1;
  die local_229;
  string buf;
  ofstream ofs;
  byte abStack_1e8 [480];
  
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  buf._M_string_length = 0;
  buf.field_2._M_local_buf[0] = '\0';
  convert(param,txtfile,&buf);
  std::ofstream::ofstream(&ofs,binfile,_S_out|_S_bin);
  if ((abStack_1e8[*(long *)(_ofs + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x215);
    poVar1 = std::operator<<(poVar1,") [");
    poVar1 = std::operator<<(poVar1,"ofs");
    poVar1 = std::operator<<(poVar1,"] ");
    poVar1 = std::operator<<(poVar1,"permission denied: ");
    std::operator<<(poVar1,binfile);
    die::~die(&local_229);
  }
  std::ostream::write((char *)&ofs,(long)buf._M_dataplus._M_p);
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&buf);
  return true;
}

Assistant:

bool FeatureIndex::compile(const Param &param,
                           const char* txtfile, const char *binfile) {
  std::string buf;
  FeatureIndex::convert(param, txtfile, &buf);
  std::ofstream ofs(WPATH(binfile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << binfile;
  ofs.write(buf.data(), buf.size());
  return true;
}